

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineMapper.h
# Opt level: O2

tuple<double,_long,_double,_long> * __thiscall
anurbs::PolylineMapper<3L>::map
          (tuple<double,_long,_double,_long> *__return_storage_ptr__,PolylineMapper<3L> *this,
          Vector *point,double tolerance)

{
  long lVar1;
  pointer pMVar2;
  RealScalar RVar3;
  Scalar *pSVar4;
  Index i;
  long lVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vector<long,_std::allocator<long>_> indices;
  Vector line_b;
  Vector line_a;
  Vector box_b;
  Vector box_a;
  double local_180;
  _Vector_base<long,_std::allocator<long>_> local_160;
  undefined1 local_148 [16];
  Vector local_138;
  Vector local_118;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  Vector *local_c0;
  Matrix<double,_1,_3,_1,_1,_3> *local_b8;
  _Any_data local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> local_88;
  Vector local_68;
  Vector local_48;
  
  local_c8 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[2];
  local_d8 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[0];
  dStack_d0 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
              .array[1];
  local_e8 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[2];
  local_f8 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[0];
  dStack_f0 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
              .array[1];
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&local_d8,lVar5)
    ;
    *pSVar4 = *pSVar4 + tolerance;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&local_f8,lVar5)
    ;
    *pSVar4 = *pSVar4 - tolerance;
  }
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_d8;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       dStack_d0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_c8;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_f8;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       dStack_f0;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_e8;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = 0;
  uStack_90 = 0;
  RTree<3L>::by_box((vector<long,_std::allocator<long>_> *)&local_160,&this->m_rtree,&local_48,
                    &local_68,(Callback *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  local_148 = ZEXT816(0x7ff0000000000000);
  local_180 = 0.0;
  lVar5 = 0;
  for (; local_160._M_impl.super__Vector_impl_data._M_start !=
         local_160._M_impl.super__Vector_impl_data._M_finish;
      local_160._M_impl.super__Vector_impl_data._M_start =
           local_160._M_impl.super__Vector_impl_data._M_start + 1) {
    lVar1 = *local_160._M_impl.super__Vector_impl_data._M_start;
    pMVar2 = (this->m_points).
             super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)&pMVar2[lVar1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage + 0x10);
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
         = *(double *)
            &pMVar2[lVar1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage;
    local_118.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
         = *(double *)
            ((long)&pMVar2[lVar1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage + 8);
    local_138.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)&pMVar2[lVar1 + 1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage + 0x10);
    local_138.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
         = *(double *)
            &pMVar2[lVar1 + 1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage;
    local_138.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
         = *(double *)
            ((long)&pMVar2[lVar1 + 1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage + 8);
    Line<3L>::closest_point(&local_88,point,&local_118,&local_138,false);
    local_b8 = &local_88.second;
    local_c0 = point;
    RVar3 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                    *)&local_c0);
    if (RVar3 <= (double)local_148._0_8_ && RVar3 <= tolerance) {
      local_180 = local_88.first;
      local_148._8_4_ = extraout_XMM0_Dc;
      local_148._0_8_ = RVar3;
      local_148._12_4_ = extraout_XMM0_Dd;
      lVar5 = lVar1;
    }
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl = lVar5 + 1;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Head_base<2UL,_double,_false>._M_head_impl = local_180;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Tuple_impl<1UL,_long,_double,_long>.super__Head_base<1UL,_long,_false>._M_head_impl = lVar5
  ;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_long,_double,_long>).
  super__Head_base<0UL,_double,_false>._M_head_impl = 1.0 - local_180;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_160);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<double, Index, double, Index> map(const Vector point, const double tolerance)
    {
        Vector box_a = point;
        Vector box_b = point;
        
        for (Index i = 0; i < TDimension; i++) {
            box_a[i] += tolerance;
            box_b[i] -= tolerance;
        }

        const auto indices = m_rtree.by_box(box_a, box_b);

        double closest_distance = Infinity;
        double closest_parameter = 0;
        Index closest_index = 0;

        for (const Index i : indices) {
            Vector line_a = m_points[i];
            Vector line_b = m_points[i + 1];

            const auto [t, cp] = Line<TDimension>::closest_point(point, line_a, line_b);

            const double distance = (point - cp).norm();

            if (distance > closest_distance || distance > tolerance) {
                continue;
            }
            
            closest_distance = distance;
            closest_parameter = t;
            closest_index = i;
        }

        return {1.0 - closest_parameter, closest_index, closest_parameter, closest_index + 1};
    }